

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleStripCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  size_t name;
  int iVar1;
  size_type sVar2;
  char *value;
  string local_b8 [32];
  char *local_98;
  size_t outLength;
  size_t cc;
  char *ptr;
  size_t endPos;
  size_t startPos;
  size_t inStringLength;
  string *variableName;
  string *stringValue;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 3) {
    variableName = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,1);
    inStringLength =
         (size_t)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,2);
    startPos = std::__cxx11::string::size();
    endPos = startPos + 1;
    ptr = (char *)0x0;
    cc = std::__cxx11::string::c_str();
    for (outLength = 0; name = inStringLength, outLength < startPos; outLength = outLength + 1) {
      iVar1 = isspace((int)*(char *)cc);
      if (iVar1 == 0) {
        if (startPos < endPos) {
          endPos = outLength;
        }
        ptr = (char *)outLength;
      }
      cc = cc + 1;
    }
    if (startPos < endPos) {
      local_98 = (char *)0x0;
      endPos = 0;
    }
    else {
      local_98 = ptr + (1 - endPos);
    }
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)variableName);
    value = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,value);
    std::__cxx11::string::~string(local_b8);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command STRIP requires two arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::HandleStripCommand(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("sub-command STRIP requires two arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  const std::string& variableName = args[2];
  size_t inStringLength = stringValue.size();
  size_t startPos = inStringLength + 1;
  size_t endPos = 0;
  const char* ptr = stringValue.c_str();
  size_t cc;
  for (cc = 0; cc < inStringLength; ++cc) {
    if (!isspace(*ptr)) {
      if (startPos > inStringLength) {
        startPos = cc;
      }
      endPos = cc;
    }
    ++ptr;
  }

  size_t outLength = 0;

  // if the input string didn't contain any non-space characters, return
  // an empty string
  if (startPos > inStringLength) {
    outLength = 0;
    startPos = 0;
  } else {
    outLength = endPos - startPos + 1;
  }

  this->Makefile->AddDefinition(
    variableName, stringValue.substr(startPos, outLength).c_str());
  return true;
}